

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

xmlBufPtr xmlBufCreateSize(size_t size)

{
  xmlBufPtr pxVar1;
  xmlBufferAllocationScheme *pxVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (size == 0xffffffffffffffff) {
LAB_00136175:
    pxVar1 = (xmlBufPtr)0x0;
  }
  else {
    pxVar1 = (xmlBufPtr)(*xmlMalloc)(0x40);
    if (pxVar1 == (xmlBufPtr)0x0) {
      __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
      return (xmlBufPtr)0x0;
    }
    pxVar1->use = 0;
    pxVar1->error = 0;
    pxVar1->buffer = (xmlBufferPtr)0x0;
    pxVar2 = __xmlBufferAllocScheme();
    uVar4 = size + 1;
    if (size == 0) {
      uVar4 = 0;
    }
    uVar6 = 0x7fffffff;
    if (uVar4 < 0x7fffffff) {
      uVar6 = uVar4;
    }
    uVar5 = 0x7fffffff;
    if (pxVar1->use < 0x7fffffff) {
      uVar5 = pxVar1->use;
    }
    pxVar1->alloc = *pxVar2;
    pxVar1->size = uVar4;
    pxVar1->compat_size = (uint)uVar6;
    pxVar1->compat_use = (uint)uVar5;
    if (size == 0) {
      pxVar1->content = (xmlChar *)0x0;
    }
    else {
      pxVar3 = (xmlChar *)(*xmlMallocAtomic)(size + 1);
      pxVar1->content = pxVar3;
      if (pxVar3 == (xmlChar *)0x0) {
        __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
        if (pxVar1->error == 0) {
          pxVar1->error = 2;
        }
        (*xmlFree)(pxVar1);
        goto LAB_00136175;
      }
      *pxVar3 = '\0';
    }
    pxVar1->contentIO = (xmlChar *)0x0;
  }
  return pxVar1;
}

Assistant:

xmlBufPtr
xmlBufCreateSize(size_t size) {
    xmlBufPtr ret;

    if (size == SIZE_MAX)
        return(NULL);
    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->alloc = xmlBufferAllocScheme;
    ret->size = (size ? size + 1 : 0);         /* +1 for ending null */
    UPDATE_COMPAT(ret);
    if (ret->size){
        ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
        if (ret->content == NULL) {
	    xmlBufMemoryError(ret, "creating buffer");
            xmlFree(ret);
            return(NULL);
        }
        ret->content[0] = 0;
    } else
	ret->content = NULL;
    ret->contentIO = NULL;
    return(ret);
}